

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_dsp.c
# Opt level: O3

void SharpYuvFilterRow_C(int16_t *A,int16_t *B,int len,uint16_t *best_y,uint16_t *out,int bit_depth)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  uint uVar5;
  uint16_t uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  if (0 < len) {
    uVar9 = ~(-1 << ((byte)bit_depth & 0x1f));
    uVar8 = 0;
    do {
      sVar1 = A[uVar8];
      sVar2 = A[uVar8 + 1];
      sVar3 = B[uVar8];
      sVar4 = B[uVar8 + 1];
      uVar7 = (uint)best_y[uVar8 * 2] +
              (sVar1 * 9 + (int)sVar4 + ((int)sVar3 + (int)sVar2) * 3 + 8 >> 4);
      uVar5 = uVar9;
      if ((int)uVar7 < (int)uVar9) {
        uVar5 = uVar7;
      }
      uVar6 = (uint16_t)uVar5;
      if ((int)uVar7 < 0) {
        uVar6 = 0;
      }
      out[uVar8 * 2] = uVar6;
      uVar7 = (uint)best_y[uVar8 * 2 + 1] +
              (((int)sVar4 + (int)sVar1) * 3 + sVar2 * 9 + (int)sVar3 + 8 >> 4);
      uVar5 = uVar9;
      if ((int)uVar7 < (int)uVar9) {
        uVar5 = uVar7;
      }
      uVar6 = (uint16_t)uVar5;
      if ((int)uVar7 < 0) {
        uVar6 = 0;
      }
      out[uVar8 * 2 + 1] = uVar6;
      uVar8 = uVar8 + 1;
    } while ((uint)len != uVar8);
  }
  return;
}

Assistant:

static void SharpYuvFilterRow_C(const int16_t* A, const int16_t* B, int len,
                                const uint16_t* best_y, uint16_t* out,
                                int bit_depth) {
  int i;
  const int max_y = (1 << bit_depth) - 1;
  for (i = 0; i < len; ++i, ++A, ++B) {
    const int v0 = (A[0] * 9 + A[1] * 3 + B[0] * 3 + B[1] + 8) >> 4;
    const int v1 = (A[1] * 9 + A[0] * 3 + B[1] * 3 + B[0] + 8) >> 4;
    out[2 * i + 0] = clip(best_y[2 * i + 0] + v0, max_y);
    out[2 * i + 1] = clip(best_y[2 * i + 1] + v1, max_y);
  }
}